

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::MatchesRegexMatcher::DescribeTo(MatchesRegexMatcher *this,ostream *os)

{
  ostream *poVar1;
  char *pcVar2;
  allocator<char> local_31;
  string local_30;
  
  pcVar2 = "contains";
  if (this->full_match_ != false) {
    pcVar2 = "matches";
  }
  poVar1 = std::operator<<(os,pcVar2);
  std::operator<<(poVar1," regular expression ");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,((this->regex_).value_)->pattern_,&local_31);
  PrintStringTo(&local_30,os);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void DescribeTo(::std::ostream* os) const {
    *os << (full_match_ ? "matches" : "contains")
        << " regular expression ";
    UniversalPrinter<internal::string>::Print(regex_->pattern(), os);
  }